

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O1

BmsWord __thiscall BmsBuffer::Get(BmsBuffer *this,barindex pos)

{
  long lVar1;
  mapped_type *pmVar2;
  long lVar3;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar4;
  long lVar5;
  key_type local_c;
  
  lVar4 = CONCAT44(in_register_00000034,pos);
  lVar1 = lVar4 + 0x10;
  lVar3 = lVar1;
  for (lVar5 = *(long *)(lVar4 + 0x18); lVar5 != 0;
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(int *)(lVar5 + 0x20) < in_EDX) * 8)) {
    if (in_EDX <= *(int *)(lVar5 + 0x20)) {
      lVar3 = lVar5;
    }
  }
  lVar5 = lVar1;
  if ((lVar3 != lVar1) && (lVar5 = lVar3, in_EDX < *(int *)(lVar3 + 0x20))) {
    lVar5 = lVar1;
  }
  if (lVar5 == lVar1) {
    BmsWord::BmsWord((BmsWord *)this,0);
  }
  else {
    pmVar2 = std::map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
             ::at((map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
                   *)(lVar4 + 8),&local_c);
    *(int *)&this->_vptr_BmsBuffer = pmVar2->value_;
  }
  return (BmsWord)(int)this;
}

Assistant:

BmsWord
BmsBuffer::Get(barindex pos) const
{
	if (array_.find(pos) == array_.end()) return 0;
	else return array_.at(pos);
}